

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selfguided_avx2.c
# Opt level: O0

__m256i * compute_p(__m256i sum1,__m256i sum2,int bit_depth,int n)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  uint in_ESI;
  int in_EDI;
  undefined8 in_XMM0_Qa;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 in_XMM0_Qb;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 in_YMM0_H;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 in_register_00001218;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined1 auVar18 [16];
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM1_Qb;
  undefined8 in_YMM1_H;
  undefined8 in_register_00001258;
  __m256i b;
  __m256i a;
  __m128i shift_b;
  __m128i shift_a;
  __m256i rounding_b;
  __m256i rounding_a;
  __m256i bb;
  __m256i an;
  uint in_stack_fffffffffffffb10;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  if (in_EDI < 9) {
    auVar11._8_8_ = in_XMM0_Qb;
    auVar11._0_8_ = in_XMM0_Qa;
    auVar11._16_8_ = in_YMM0_H;
    auVar11._24_8_ = in_register_00001218;
    auVar10._8_8_ = in_XMM0_Qb;
    auVar10._0_8_ = in_XMM0_Qa;
    auVar10._16_8_ = in_YMM0_H;
    auVar10._24_8_ = in_register_00001218;
    local_440 = vpmaddwd_avx2(auVar11,auVar10);
    auVar1 = vpinsrd_avx(ZEXT416(in_ESI),in_ESI,1);
    auVar1 = vpinsrd_avx(auVar1,in_ESI,2);
    auVar1 = vpinsrd_avx(auVar1,in_ESI,3);
    auVar2 = vpinsrd_avx(ZEXT416(in_ESI),in_ESI,1);
    auVar2 = vpinsrd_avx(auVar2,in_ESI,2);
    auVar2 = vpinsrd_avx(auVar2,in_ESI,3);
    auVar18 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
    uStack_70 = auVar18._0_8_;
    uStack_68 = auVar18._8_8_;
    auVar4._8_8_ = in_XMM1_Qb;
    auVar4._0_8_ = in_XMM1_Qa;
    auVar4._16_8_ = in_YMM1_H;
    auVar4._24_8_ = in_register_00001258;
    auVar3._16_8_ = uStack_70;
    auVar3._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar2;
    auVar3._24_8_ = uStack_68;
    local_420 = vpmulld_avx2(auVar4,auVar3);
  }
  else {
    uVar12 = in_XMM0_Qa;
    uVar14 = in_XMM0_Qb;
    uVar16 = in_YMM0_H;
    uVar19 = in_register_00001218;
    round_for_shift(in_stack_fffffffffffffb10);
    uVar13 = uVar12;
    uVar15 = uVar14;
    uVar17 = uVar16;
    uVar20 = uVar19;
    round_for_shift(in_stack_fffffffffffffb10);
    auVar8._8_8_ = in_XMM1_Qb;
    auVar8._0_8_ = in_XMM1_Qa;
    auVar8._16_8_ = in_YMM1_H;
    auVar8._24_8_ = in_register_00001258;
    auVar7._8_8_ = uVar14;
    auVar7._0_8_ = uVar12;
    auVar7._16_8_ = uVar16;
    auVar7._24_8_ = uVar19;
    auVar3 = vpaddd_avx2(auVar8,auVar7);
    auVar4 = vpsrld_avx2(auVar3,ZEXT416(in_EDI * 2 - 0x10));
    auVar6._8_8_ = in_XMM0_Qb;
    auVar6._0_8_ = in_XMM0_Qa;
    auVar6._16_8_ = in_YMM0_H;
    auVar6._24_8_ = in_register_00001218;
    auVar5._8_8_ = uVar15;
    auVar5._0_8_ = uVar13;
    auVar5._16_8_ = uVar17;
    auVar5._24_8_ = uVar20;
    auVar3 = vpaddd_avx2(auVar6,auVar5);
    auVar3 = vpsrld_avx2(auVar3,ZEXT416(in_EDI - 8));
    local_440 = vpmaddwd_avx2(auVar3,auVar3);
    auVar1 = vpinsrd_avx(ZEXT416(in_ESI),in_ESI,1);
    auVar1 = vpinsrd_avx(auVar1,in_ESI,2);
    auVar1 = vpinsrd_avx(auVar1,in_ESI,3);
    auVar2 = vpinsrd_avx(ZEXT416(in_ESI),in_ESI,1);
    auVar2 = vpinsrd_avx(auVar2,in_ESI,2);
    auVar2 = vpinsrd_avx(auVar2,in_ESI,3);
    auVar18 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
    uStack_b0 = auVar18._0_8_;
    uStack_a8 = auVar18._8_8_;
    auVar9._16_8_ = uStack_b0;
    auVar9._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar2;
    auVar9._24_8_ = uStack_a8;
    auVar3 = vpmulld_avx2(auVar4,auVar9);
    local_420 = vpmaxsd_avx2(auVar3,local_440);
  }
  vpsubd_avx2(local_420,local_440);
  return (__m256i *)(ulong)in_ESI;
}

Assistant:

static __m256i compute_p(__m256i sum1, __m256i sum2, int bit_depth, int n) {
  __m256i an, bb;
  if (bit_depth > 8) {
    const __m256i rounding_a = round_for_shift(2 * (bit_depth - 8));
    const __m256i rounding_b = round_for_shift(bit_depth - 8);
    const __m128i shift_a = _mm_cvtsi32_si128(2 * (bit_depth - 8));
    const __m128i shift_b = _mm_cvtsi32_si128(bit_depth - 8);
    const __m256i a =
        _mm256_srl_epi32(_mm256_add_epi32(sum2, rounding_a), shift_a);
    const __m256i b =
        _mm256_srl_epi32(_mm256_add_epi32(sum1, rounding_b), shift_b);
    // b < 2^14, so we can use a 16-bit madd rather than a 32-bit
    // mullo to square it
    bb = _mm256_madd_epi16(b, b);
    an = _mm256_max_epi32(_mm256_mullo_epi32(a, _mm256_set1_epi32(n)), bb);
  } else {
    bb = _mm256_madd_epi16(sum1, sum1);
    an = _mm256_mullo_epi32(sum2, _mm256_set1_epi32(n));
  }
  return _mm256_sub_epi32(an, bb);
}